

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

void __thiscall
VulkanHppGenerator::addCommandsToHandle
          (VulkanHppGenerator *this,
          vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
          *requireData)

{
  iterator commandName;
  bool bVar1;
  reference pRVar2;
  pointer ppVar3;
  pointer ppVar4;
  _Self local_78;
  _Self local_70;
  iterator handleIt;
  _Self local_60;
  iterator commandIt;
  NameLine *command;
  const_iterator __end2;
  const_iterator __begin2;
  vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_> *__range2;
  RequireData *require;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *__range1;
  vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
  *requireData_local;
  VulkanHppGenerator *this_local;
  
  __end1 = std::
           vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
           ::begin(requireData);
  require = (RequireData *)
            std::
            vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
            ::end(requireData);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                      (&__end1,(__normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
                                *)&require);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
             ::operator*(&__end1);
    __end2 = std::
             vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
             begin(&pRVar2->commands);
    command = (NameLine *)
              std::
              vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>::
              end(&pRVar2->commands);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                        (&__end2,(__normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
                                  *)&command);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      commandIt._M_node =
           (_Base_ptr)
           __gnu_cxx::
           __normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
           ::operator*(&__end2);
      local_60._M_node =
           (_Base_ptr)
           anon_unknown.dwarf_b1723::findByNameOrAlias<VulkanHppGenerator::CommandData>
                     (&this->m_commands,(string *)commandIt._M_node);
      handleIt._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
           ::end(&this->m_commands);
      bVar1 = std::operator==(&local_60,(_Self *)&handleIt);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("commandIt != m_commands.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x23f,
                      "void VulkanHppGenerator::addCommandsToHandle(const std::vector<RequireData> &)"
                     );
      }
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
               ::operator->(&local_60);
      local_70._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
           ::find(&this->m_handles,&(ppVar3->second).handle);
      local_78._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
           ::end(&this->m_handles);
      bVar1 = std::operator==(&local_70,&local_78);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("handleIt != m_handles.end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x241,
                      "void VulkanHppGenerator::addCommandsToHandle(const std::vector<RequireData> &)"
                     );
      }
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>
               ::operator->(&local_70);
      bVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::contains(&(ppVar4->second).commands,(key_type *)commandIt._M_node);
      if (!bVar1) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>
                 ::operator->(&local_70);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&(ppVar4->second).commands,(value_type *)commandIt._M_node);
        commandName = commandIt;
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
                 ::operator->(&local_60);
        registerDeleter(this,(string *)commandName._M_node,&ppVar3->second);
      }
      __gnu_cxx::
      __normal_iterator<const_VulkanHppGenerator::NameLine_*,_std::vector<VulkanHppGenerator::NameLine,_std::allocator<VulkanHppGenerator::NameLine>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_VulkanHppGenerator::RequireData_*,_std::vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void VulkanHppGenerator::addCommandsToHandle( std::vector<RequireData> const & requireData )
{
  for ( auto const & require : requireData )
  {
    for ( auto const & command : require.commands )
    {
      auto commandIt = findByNameOrAlias( m_commands, command.name );
      assert( commandIt != m_commands.end() );
      auto handleIt = m_handles.find( commandIt->second.handle );
      assert( handleIt != m_handles.end() );
      if ( !handleIt->second.commands.contains( command.name ) )
      {
        handleIt->second.commands.insert( command.name );
        registerDeleter( command.name, commandIt->second );
      }
    }
  }
}